

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O2

string * __thiscall
soul::PaddedStringTable::getCell_abi_cxx11_(PaddedStringTable *this,size_t row,size_t column)

{
  ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  this_00 = ArrayWithPreallocation<soul::ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>,_16UL>
            ::operator[](&this->rows,row);
  pbVar1 = ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           ::operator[](this_00,column);
  return pbVar1;
}

Assistant:

std::string& PaddedStringTable::getCell (size_t row, size_t column)
{
    return rows[row][column];
}